

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O1

NamespaceDeclaration * __thiscall
QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
          (QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this)

{
  qsizetype *pqVar1;
  long lVar2;
  NamespaceDeclaration *pNVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = this->cap;
  if (lVar4 <= this->tos + 1) {
    lVar5 = this->tos + 2;
    lVar2 = lVar4 * 2;
    if (lVar5 != lVar2 && SBORROW8(lVar5,lVar2) == lVar5 + lVar4 * -2 < 0) {
      lVar2 = lVar5;
    }
    this->cap = lVar2;
    pNVar3 = (NamespaceDeclaration *)realloc(this->data,lVar2 * 0x30);
    this->data = pNVar3;
    if (pNVar3 == (NamespaceDeclaration *)0x0) {
      qBadAlloc();
    }
  }
  pNVar3 = this->data;
  lVar4 = this->tos + 1;
  this->tos = lVar4;
  pqVar1 = &pNVar3[lVar4].namespaceUri.m_pos;
  *pqVar1 = 0;
  pqVar1[1] = 0;
  pqVar1 = &pNVar3[lVar4].prefix.m_size;
  *pqVar1 = 0;
  pqVar1[1] = 0;
  pNVar3[lVar4].prefix.m_string = (QString *)0x0;
  pNVar3[lVar4].prefix.m_pos = 0;
  return pNVar3 + lVar4;
}

Assistant:

inline T &push() { reserve(1); return rawPush(); }